

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_optimizer.c
# Opt level: O2

gravity_function_t * gravity_optimizer(gravity_function_t *f,_Bool add_debug)

{
  optag_t oVar1;
  opcode_t oVar2;
  optag_t oVar3;
  ircode_t *piVar4;
  gravity_function_t *f_00;
  inst_t *piVar5;
  _Bool _Var6;
  uint8_t uVar7;
  _Bool _Var8;
  uint16_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t i_00;
  uint uVar12;
  uint uVar13;
  inst_t *piVar14;
  inst_t *inst;
  int64_t iVar15;
  gravity_hash_t *hashtable;
  uint32_t *puVar16;
  gravity_value_t *pgVar17;
  int64_t n;
  long lVar18;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar19;
  uint uVar20;
  gravity_class_t *pgVar21;
  bool bVar22;
  uint32_t i_1;
  uint uVar23;
  inst_t *inst_00;
  size_t size;
  uint32_t i;
  ulong uVar24;
  ulong uVar25;
  undefined7 in_register_00000031;
  int64_t iVar26;
  uint32_t i_2;
  optag_t oVar27;
  float fVar28;
  double dVar29;
  gravity_value_t value;
  gravity_value_t v;
  gravity_value_t key;
  gravity_value_t key_00;
  gravity_value_t key_01;
  double local_58;
  uint32_t *local_50;
  inst_t *local_48;
  int local_40;
  undefined4 local_3c;
  gravity_function_t *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000031,add_debug);
  piVar4 = *(ircode_t **)((long)&f->field_9 + 0x50);
  if (piVar4 == (ircode_t *)0x0) {
    return f;
  }
  uVar10 = ircode_count(piVar4);
  uVar11 = ircode_ntemps(piVar4);
  f->ntemps = (uint16_t)uVar11;
  uVar11 = 0;
  local_38 = f;
LAB_00114fa0:
  do {
    if (uVar11 == uVar10) break;
    piVar14 = current_instruction(piVar4,uVar11);
    if ((piVar14 != (inst_t *)0x0) && (piVar14->op == NEG)) {
      local_48 = (inst_t *)0x0;
      pop1_instruction(piVar4,uVar11,&local_48);
      piVar5 = local_48;
      if ((local_48 != (inst_t *)0x0) &&
         (((local_48->op == LOADI && (local_48->p1 == piVar14->p2)) &&
          (_Var6 = ircode_register_istemp(piVar4,local_48->p1), _Var6)))) {
        if (piVar5->tag == DOUBLE_TAG) {
          piVar5->p1 = piVar14->p2;
          (piVar5->field_5).n = (piVar5->field_5).n ^ 0x8000000000000000;
        }
        else {
          if ((piVar5->tag != INT_TAG) || (0x20000 < (piVar5->field_5).n)) goto LAB_00115027;
          piVar5->p1 = piVar14->p2;
          (piVar5->field_5).n = -(piVar5->field_5).n;
        }
        inst_setskip(piVar14);
        uVar11 = 0;
        goto LAB_00114fa0;
      }
    }
LAB_00115027:
    uVar11 = uVar11 + 1;
  } while( true );
LAB_0011505a:
  uVar11 = 0;
LAB_0011505c:
  i_00 = uVar11;
  if (i_00 == uVar10) goto LAB_001153bf;
  piVar14 = current_instruction(piVar4,i_00);
  if ((piVar14 == (inst_t *)0x0) || (4 < piVar14->op - ADD)) goto LAB_0011520a;
  uVar7 = opcode_numop(piVar14->op);
  if (uVar7 != '\x03') {
    pop1_instruction(piVar4,i_00,&local_48);
    goto LAB_0011520a;
  }
  uVar11 = i_00;
  piVar5 = (inst_t *)0x0;
  do {
    inst_00 = piVar5;
    uVar11 = uVar11 - 1;
    if ((int)uVar11 < 0) {
      if (inst_00 == (inst_t *)0x0) goto LAB_0011520a;
      inst = (inst_t *)0x0;
      bVar22 = false;
      goto LAB_0011515d;
    }
    inst = ircode_get(piVar4,uVar11);
    piVar5 = inst_00;
  } while (((inst == (inst_t *)0x0) || (oVar1 = inst->tag, oVar1 == SKIP_TAG)) ||
          (piVar5 = inst, inst_00 == (inst_t *)0x0));
  if (inst->op != LOADI) goto LAB_001152e3;
  oVar2 = inst_00->op;
  if (oVar2 != LOADI) {
    bVar22 = false;
    goto LAB_00115161;
  }
  oVar3 = inst_00->tag;
  oVar27 = DOUBLE_TAG;
  if (oVar1 == oVar3) {
    oVar27 = oVar1;
  }
  if (piVar14->p2 != inst->p1) {
    bVar22 = false;
    goto LAB_0011515d;
  }
  if (piVar14->p3 != inst_00->p2) {
LAB_001152e3:
    bVar22 = false;
    goto LAB_0011515d;
  }
  if (oVar27 == DOUBLE_TAG) {
    if (oVar1 == INT_TAG) {
      local_58 = (double)(inst->field_5).n;
    }
    else {
      local_58 = (inst->field_5).d;
    }
    if (oVar3 == INT_TAG) {
      dVar29 = (double)(inst_00->field_5).n;
    }
    else {
      dVar29 = (inst_00->field_5).d;
    }
    iVar15 = 0;
    iVar26 = 0;
  }
  else {
    if (oVar1 == INT_TAG) {
      iVar15 = (inst->field_5).n;
    }
    else {
      iVar15 = (int64_t)(inst->field_5).d;
    }
    if (oVar3 == INT_TAG) {
      iVar26 = (inst_00->field_5).n;
    }
    else {
      iVar26 = (int64_t)(inst_00->field_5).d;
    }
    local_58 = 0.0;
    dVar29 = 0.0;
  }
  if (4 < piVar14->op - ADD) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                  ,0x154,"_Bool optimize_const_instruction(inst_t *, inst_t *, inst_t *)");
  }
  lVar18 = (long)dVar29;
  switch(piVar14->op) {
  case ADD:
    if (oVar27 == DOUBLE_TAG) {
      local_58 = local_58 + dVar29;
      goto LAB_0011530b;
    }
    local_50 = (uint32_t *)(iVar26 + iVar15);
LAB_0011531f:
    local_58 = 0.0;
    break;
  case SUB:
    if (oVar27 == DOUBLE_TAG) {
      local_58 = local_58 - dVar29;
      goto LAB_0011530b;
    }
    local_50 = (uint32_t *)(iVar15 - iVar26);
LAB_00115350:
    local_58 = 0.0;
    break;
  case DIV:
    if (lVar18 == 0) goto LAB_001152e3;
    if (oVar27 != DOUBLE_TAG) {
      local_50 = (uint32_t *)(iVar15 / iVar26);
      goto LAB_00115350;
    }
    local_58 = local_58 / dVar29;
    goto LAB_0011530b;
  case MUL:
    if (oVar27 != DOUBLE_TAG) {
      local_50 = (uint32_t *)(iVar26 * iVar15);
      goto LAB_0011531f;
    }
    local_58 = local_58 * dVar29;
LAB_0011530b:
    local_50 = (uint32_t *)0x0;
    break;
  case REM:
    if (lVar18 == 0) goto LAB_001152e3;
    if (oVar27 == DOUBLE_TAG) {
      local_58 = (double)((long)local_58 % lVar18);
      goto LAB_0011530b;
    }
    local_50 = (uint32_t *)(iVar15 % iVar26);
    local_58 = 0.0;
  }
  inst_setskip(inst);
  inst_setskip(inst_00);
  piVar14->p2 = 0;
  piVar14->p3 = 0;
  piVar14->op = LOADI;
  piVar14->tag = oVar27;
  if (oVar27 == DOUBLE_TAG) {
    (piVar14->field_5).d = local_58;
  }
  else {
    (piVar14->field_5).d = (double)local_50;
  }
  bVar22 = true;
LAB_0011515d:
  oVar2 = inst_00->op;
LAB_00115161:
  if (oVar2 == MOVE) {
    _Var6 = ircode_register_istemp(piVar4,piVar14->p3);
    _Var8 = ircode_register_istemp(piVar4,inst_00->p1);
    if (((_Var6) && (_Var8)) && (piVar14->p3 == inst_00->p1)) {
      piVar14->p3 = inst_00->p2;
      inst_setskip(inst_00);
      bVar22 = true;
    }
  }
  if ((inst != (inst_t *)0x0) && (inst->op == MOVE)) {
    _Var6 = ircode_register_istemp(piVar4,piVar14->p2);
    _Var8 = ircode_register_istemp(piVar4,inst->p1);
    if ((_Var6) && ((_Var8 && (piVar14->p2 == inst->p1)))) goto LAB_001153aa;
  }
  uVar11 = 0;
  if (!bVar22) {
LAB_0011520a:
    uVar11 = i_00 + 1;
  }
  goto LAB_0011505c;
LAB_001153bf:
  bVar22 = true;
  uVar11 = 0;
  do {
    if (uVar11 == uVar10) {
      uVar11 = 0;
      break;
    }
    piVar14 = current_instruction(piVar4,uVar11);
    if (piVar14 != (inst_t *)0x0) {
      if (piVar14->tag == PRAGMA_MOVE_OPTIMIZATION) {
        if (piVar14->p1 == 0) {
LAB_0011545e:
          bVar22 = false;
          goto LAB_00115460;
        }
      }
      else if (!bVar22) goto LAB_0011545e;
      bVar22 = true;
      if (piVar14->op == MOVE) {
        local_48 = (inst_t *)0x0;
        pop1_instruction(piVar4,uVar11,&local_48);
        piVar5 = local_48;
        if ((local_48 != (inst_t *)0x0) && (local_48->op - LOADK < 3)) {
          _Var6 = ircode_register_istemp(piVar4,piVar14->p2);
          _Var8 = ircode_register_istemp(piVar4,piVar5->p1);
          if ((_Var6) && ((_Var8 && (piVar14->p2 == piVar5->p1)))) goto LAB_00115467;
        }
      }
    }
LAB_00115460:
    uVar11 = uVar11 + 1;
  } while( true );
LAB_00115484:
  f_00 = local_38;
  if (uVar11 == uVar10) goto LAB_001154f2;
  piVar14 = current_instruction(piVar4,uVar11);
  if ((piVar14 != (inst_t *)0x0) && (piVar14->op == RET)) {
    local_48 = (inst_t *)0x0;
    pop1_instruction(piVar4,uVar11,&local_48);
    _Var6 = ircode_register_istemp(piVar4,piVar14->p1);
    if ((_Var6) &&
       (((local_48 != (inst_t *)0x0 && (local_48->op == MOVE)) && (piVar14->p1 == local_48->p1)))) {
      piVar14->p1 = local_48->p2;
      inst_setskip(local_48);
      uVar11 = 0;
      goto LAB_00115484;
    }
  }
  uVar11 = uVar11 + 1;
  goto LAB_00115484;
LAB_001154f2:
  for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    piVar14 = current_instruction(piVar4,uVar11);
    if ((piVar14 != (inst_t *)0x0) && (piVar14->op == LOADI)) {
      if (piVar14->tag == DOUBLE_TAG) {
        aVar19 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(piVar14->field_5).n;
        pgVar21 = gravity_class_float;
      }
      else if ((piVar14->tag != INT_TAG) ||
              (aVar19 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(piVar14->field_5).n,
              pgVar21 = gravity_class_int, 0xfffffffffffbffff < aVar19.n - 0x20001U))
      goto LAB_0011556e;
      v.field_1.n = aVar19.n;
      v.isa = pgVar21;
      uVar9 = gravity_function_cpool_add((gravity_vm *)0x0,f_00,v);
      piVar14->op = LOADK;
      piVar14->tag = NO_TAG;
      piVar14->p2 = (uint)uVar9;
    }
LAB_0011556e:
  }
  piVar4 = (ircode_t *)(f_00->field_9).field_0.bytecode;
  uVar10 = ircode_count(piVar4);
  hashtable = gravity_hash_create(0,hash_compute,hash_isequal,(gravity_hash_iterate_fn)0x0,
                                  (void *)0x0);
  uVar23 = 0;
  for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    piVar14 = ircode_get(piVar4,uVar11);
    oVar1 = piVar14->tag;
    if ((oVar1 != PRAGMA_MOVE_OPTIMIZATION) && (oVar1 != SKIP_TAG)) {
      if (oVar1 == LABEL_TAG) {
        key.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar14->p1;
        value.field_1.n._0_4_ = uVar23;
        value.isa = gravity_class_int;
        value.field_1.n._4_4_ = 0;
        key.isa = gravity_class_int;
        gravity_hash_insert(hashtable,key,value);
      }
      else {
        uVar23 = uVar23 + 1;
      }
    }
  }
  (f_00->field_9).field_0.ninsts = uVar23;
  size = (ulong)(uVar23 + 1) << 2;
  local_50 = (uint32_t *)0x0;
  puVar16 = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,size);
  if ((char)local_3c != '\0') {
    local_50 = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,size);
  }
  if (puVar16 == (uint32_t *)0x0) {
    __assert_fail("bytecode",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                  ,0x4d,"void finalize_function(gravity_function_t *, _Bool)");
  }
  uVar11 = 0;
  local_40 = 0;
  uVar24 = 0;
  do {
    if (uVar10 == uVar11) {
      ircode_free(piVar4);
      gravity_hash_free(hashtable);
      (local_38->field_9).field_0.bytecode = puVar16;
      (local_38->field_9).field_0.lineno = local_50;
      if (local_40 == 0) {
        fVar28 = 1.0;
      }
      else {
        fVar28 = ((float)(uint)(local_40 * 100) / (float)uVar23) / 100.0;
      }
      (local_38->field_9).field_0.purity = fVar28;
      return local_38;
    }
    piVar14 = ircode_get(piVar4,uVar11);
    oVar1 = piVar14->tag;
    if ((oVar1 < 8) && (uVar25 = uVar24, (0x98U >> (oVar1 & 0x1f) & 1) != 0)) goto LAB_0011589b;
    oVar2 = piVar14->op;
    switch(oVar2) {
    case RET0:
    case HALT:
    case NOP:
      uVar13 = oVar2 << 0x1a;
      break;
    case RET:
      uVar13 = (piVar14->p1 & 0xffU) << 0x12 | 0xc000000;
      break;
    case CALL:
      uVar13 = (piVar14->p3 & 0x3ffU) +
               ((piVar14->p2 & 0xffU) << 10 | (piVar14->p1 & 0xffU) << 0x12) + 0x10000000;
      break;
    case LOAD:
    case STORE:
      local_40 = local_40 + 1;
    case LOADS:
    case LOADAT:
    case STOREAT:
    case ADD:
    case SUB:
    case DIV:
    case MUL:
    case REM:
    case AND:
    case OR:
    case LT:
    case GT:
    case EQ:
    case LEQ:
    case GEQ:
    case NEQ:
    case EQQ:
    case NEQQ:
    case ISA:
    case MATCH:
    case NEG:
    case NOT:
    case LSHIFT:
    case RSHIFT:
    case BAND:
    case BOR:
    case BXOR:
    case BNOT:
      uVar13 = piVar14->p3 & 0x3ffU |
               (piVar14->p2 & 0xffU) << 10 | (piVar14->p1 & 0xffU) << 0x12 | oVar2 << 0x1a;
      break;
    case LOADG:
    case LOADU:
    case STOREG:
    case STOREU:
      local_40 = local_40 + 1;
    case LOADK:
    case MOVE:
    case MAPNEW:
    case LISTNEW:
    case CLOSURE:
    case CLOSE:
      uVar13 = (piVar14->p1 & 0xffU) << 0x12 | oVar2 << 0x1a;
      uVar12 = piVar14->p2;
      uVar20 = 0x3ffff;
      goto LAB_001156e4;
    case LOADI:
      uVar13 = ((uint)((ulong)(piVar14->field_5).n >> 0x2e) & 0x20000) +
               ((uint)(piVar14->field_5).n & 0x1ffff | (piVar14->p1 & 0xffU) << 0x12) + 0x28000000;
      break;
    case JUMP:
      key_00.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar14->p1;
      key_00.isa = gravity_class_int;
      pgVar17 = gravity_hash_lookup(hashtable,key_00);
      if (pgVar17 == (gravity_value_t *)0x0) {
        __assert_fail("v",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                      ,0x94,"void finalize_function(gravity_function_t *, _Bool)");
      }
      uVar13 = piVar14->op << 0x1a;
      uVar12 = *(uint *)&pgVar17->field_1;
      uVar20 = 0x3ffffff;
      goto LAB_001156e4;
    case JUMPF:
      key_01.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar14->p2;
      key_01.isa = gravity_class_int;
      pgVar17 = gravity_hash_lookup(hashtable,key_01);
      if (pgVar17 == (gravity_value_t *)0x0) {
        __assert_fail("v",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                      ,0x86,"void finalize_function(gravity_function_t *, _Bool)");
      }
      uVar13 = (piVar14->p3 & 1U) << 0x11 | (piVar14->p1 & 0xffU) << 0x12 | piVar14->op << 0x1a;
      uVar12 = *(uint *)&pgVar17->field_1;
      uVar20 = 0x1ffff;
LAB_001156e4:
      uVar13 = uVar12 & uVar20 | uVar13;
      break;
    case SWITCH:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                    ,0xbb,"void finalize_function(gravity_function_t *, _Bool)");
    case RANGENEW:
      uVar13 = ((uint)(oVar1 != RANGE_INCLUDE_TAG) | (piVar14->p1 & 0xffU) << 0x12 |
               (piVar14->p2 & 0xffU) << 10) + (piVar14->p3 & 0xffU) * 4 + 0xbc000000;
      break;
    case SETLIST:
      uVar13 = (piVar14->p3 & 0x3ffU) +
               ((piVar14->p2 & 0xffU) << 10 | (piVar14->p1 & 0xffU) << 0x12) + 0xc0000000;
      break;
    case CHECK:
      uVar13 = (piVar14->p1 & 0xffU) * 0x40000 + (piVar14->p2 & 0x3ffffU) + 0xcc000000;
      break;
    case RESERVED2:
    case RESERVED3:
    case RESERVED4:
    case RESERVED5:
    case RESERVED6:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                    ,0xcc,"void finalize_function(gravity_function_t *, _Bool)");
    default:
      uVar13 = 0;
    }
    if ((char)local_3c != '\0') {
      local_50[uVar24] = piVar14->lineno;
    }
    uVar25 = (ulong)((int)uVar24 + 1);
    puVar16[uVar24] = uVar13;
LAB_0011589b:
    uVar11 = uVar11 + 1;
    uVar24 = uVar25;
  } while( true );
LAB_00115467:
  piVar5->p1 = piVar14->p1;
  inst_setskip(piVar14);
  goto LAB_001153bf;
LAB_001153aa:
  piVar14->p2 = inst->p2;
  inst_setskip(inst);
  goto LAB_0011505a;
}

Assistant:

gravity_function_t *gravity_optimizer(gravity_function_t *f, bool add_debug) {
    if (f->bytecode == NULL) return f;

    ircode_t    *code = (ircode_t *)f->bytecode;
    uint32_t    count = ircode_count(code);
    bool        optimizer = true;

    f->ntemps = ircode_ntemps(code);

    loop_neg:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NEG(inst)) {
            bool b = optimize_neg_instruction (code, inst, i);
            if (b) goto loop_neg;
        }
    }

    loop_math:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_MATH(inst)) {
            bool b = optimize_math_instruction (code, inst, i);
            if (b) goto loop_math;
        }
    }

    loop_move:
    optimizer = true;
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_PRAGMA_MOVE_OPT(inst)) optimizer = (bool)inst->p1;
        if (optimizer && IS_MOVE(inst)) {
            bool b = optimize_move_instruction (code, inst, i);
            if (b) goto loop_move;
        }
    }

    loop_ret:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_RET(inst)) {
            bool b = optimize_return_instruction (code, inst, i);
            if (b) goto loop_ret;
        }
    }

    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NUM(inst)) optimize_num_instruction (inst, f);
    }

    // dump optimized version
    #if GRAVITY_BYTECODE_DEBUG
    gravity_function_dump(f, ircode_dump);
    #endif

    // finalize function
	finalize_function(f, add_debug);

    return f;
}